

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::NamedBlockClauseSyntax::getChild(NamedBlockClauseSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  long in_RDX;
  ConstTokenOrSyntax *in_RSI;
  Info *in_RDI;
  undefined8 in_stack_ffffffffffffffa8;
  
  if (in_RDX == 0) {
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffa8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x1ed5eb,token);
  }
  else if (in_RDX == 1) {
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffffa8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x1ed618,token_00);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
  }
  return (ConstTokenOrSyntax *)in_RDI;
}

Assistant:

ConstTokenOrSyntax NamedBlockClauseSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return colon;
        case 1: return name;
        default: return nullptr;
    }
}